

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_crossing_analysis.cc
# Opt level: O0

bool __thiscall
sptk::ZeroCrossingAnalysis::Run
          (ZeroCrossingAnalysis *this,vector<double,_std::allocator<double>_> *signals,
          int *num_zero_crossing,Buffer *buffer)

{
  bool bVar1;
  size_type sVar2;
  const_reference pvVar3;
  long in_RCX;
  uint *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  long in_RDI;
  int i;
  int count;
  double *x;
  int local_38;
  uint local_34;
  bool local_1;
  
  if (((((*(byte *)(in_RDI + 0xc) & 1) == 0) ||
       (sVar2 = std::vector<double,_std::allocator<double>_>::size(in_RSI),
       sVar2 != (long)*(int *)(in_RDI + 8))) || (in_RDX == (uint *)0x0)) || (in_RCX == 0)) {
    local_1 = false;
  }
  else {
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](in_RSI,0);
    if ((*(byte *)(in_RCX + 8) & 1) != 0) {
      *(value_type *)(in_RCX + 0x10) = *pvVar3;
      *(undefined1 *)(in_RCX + 8) = 0;
    }
    bVar1 = anon_unknown.dwarf_4db4::IsCrossed(*(double *)(in_RCX + 0x10),*pvVar3);
    local_34 = (uint)bVar1;
    for (local_38 = 1; local_38 < *(int *)(in_RDI + 8); local_38 = local_38 + 1) {
      bVar1 = anon_unknown.dwarf_4db4::IsCrossed(pvVar3[local_38 + -1],pvVar3[local_38]);
      if (bVar1) {
        local_34 = local_34 + 1;
      }
    }
    *(value_type *)(in_RCX + 0x10) = pvVar3[*(int *)(in_RDI + 8) + -1];
    *in_RDX = local_34;
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ZeroCrossingAnalysis::Run(const std::vector<double>& signals,
                               int* num_zero_crossing,
                               ZeroCrossingAnalysis::Buffer* buffer) const {
  // Check inputs.
  if (!is_valid_ || signals.size() != static_cast<std::size_t>(frame_length_) ||
      NULL == num_zero_crossing || NULL == buffer) {
    return false;
  }

  const double* x(&(signals[0]));

  if (buffer->is_first_frame_) {
    buffer->latest_signal_ = x[0];
    buffer->is_first_frame_ = false;
  }

  int count(0);
  if (IsCrossed(buffer->latest_signal_, x[0])) {
    ++count;
  }
  for (int i(1); i < frame_length_; ++i) {
    if (IsCrossed(x[i - 1], x[i])) {
      ++count;
    }
  }

  buffer->latest_signal_ = x[frame_length_ - 1];
  *num_zero_crossing = count;

  return true;
}